

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_impl.hpp
# Opt level: O0

void __thiscall
xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::AddEdge
          (Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> *this,SquareCell sstate,
          SquareCell dstate,double trans)

{
  SquareCell dst_state;
  bool bVar1;
  const_vertex_iterator cVar2;
  pointer pEVar3;
  ostream *poVar4;
  vertex_iterator *in_RDI;
  double in_XMM0_Qa;
  int64_t in_stack_00000018;
  _List_node_base *in_stack_00000028;
  vertex_iterator dst_vertex;
  SquareCell in_stack_00000040;
  edge_iterator it;
  vertex_iterator src_vertex;
  Vertex *this_00;
  value_type *__x;
  list<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>
  *in_stack_ffffffffffffff70;
  list<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Edge,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Edge>_>
  *this_01;
  _Self local_58;
  Vertex *local_50;
  _List_node_base *local_48;
  size_t local_40;
  _Self in_stack_ffffffffffffffc8;
  double dVar5;
  
  this_01 = (list<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Edge,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Edge>_>
             *)&stack0x00000020;
  cVar2.super_VertexMapTypeIterator.
  super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_false>
  ._M_cur = (VertexMapTypeIterator)
            ObtainVertexFromVertexMap
                      ((Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> *)
                       in_stack_00000028,in_stack_00000040);
  vertex_iterator::operator->((vertex_iterator *)0x1083d2);
  this_00 = (Vertex *)
            (this_01->
            super__List_base<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Edge,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Edge>_>
            )._M_impl._M_node.super__List_node_base._M_next;
  local_48 = (this_01->
             super__List_base<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Edge,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Edge>_>
             )._M_impl._M_node.super__List_node_base._M_prev;
  local_40 = (this_01->
             super__List_base<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Edge,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Edge>_>
             )._M_impl._M_node._M_size;
  dst_state.idx.y =
       (int64_t)cVar2.super_VertexMapTypeIterator.
                super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_false>
                ._M_cur;
  dst_state.idx.x = in_stack_00000018;
  dst_state.id = (int64_t)in_XMM0_Qa;
  local_50 = this_00;
  Vertex::FindEdge<SquareCell,_nullptr>((Vertex *)in_stack_ffffffffffffffc8._M_node,dst_state);
  vertex_iterator::operator->((vertex_iterator *)0x108429);
  local_58._M_node = (_List_node_base *)Vertex::edge_end(this_00);
  bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffc8,&local_58);
  if (bVar1) {
    dVar5 = in_XMM0_Qa;
    pEVar3 = std::
             _List_iterator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Edge>
             ::operator->((_List_iterator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Edge>
                           *)0x108464);
    pEVar3->cost = in_XMM0_Qa;
    poVar4 = std::operator<<((ostream *)&std::cout,"updated cost: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar5);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    __x = (value_type *)
          (this_01->
          super__List_base<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Edge,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Edge>_>
          )._M_impl._M_node._M_size;
    ObtainVertexFromVertexMap
              ((Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> *)in_stack_00000028,
               in_stack_00000040);
    vertex_iterator::operator->((vertex_iterator *)0x1084fd);
    std::__cxx11::
    list<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>
    ::push_back(in_stack_ffffffffffffff70,__x);
    vertex_iterator::operator->((vertex_iterator *)0x10851e);
    std::__cxx11::
    list<xmotion::Graph<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>::Edge,std::allocator<xmotion::Graph<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>::Edge>>
    ::
    emplace_back<xmotion::Graph<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>::vertex_iterator&,xmotion::Graph<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>::vertex_iterator&,double&>
              (this_01,in_RDI,(vertex_iterator *)in_stack_ffffffffffffff70,(double *)__x);
  }
  return;
}

Assistant:

void Graph<State, Transition, StateIndexer>::AddEdge(State sstate, State dstate,
                                                     Transition trans) {
  auto src_vertex = ObtainVertexFromVertexMap(sstate);

  // update transition if edge already exists
  auto it = src_vertex->FindEdge(dstate);
  if (it != src_vertex->edge_end()) {
    it->cost = trans;
    std::cout << "updated cost: " << trans << std::endl;
    return;
  }

  // otherwise add new edge
  auto dst_vertex = ObtainVertexFromVertexMap(dstate);
  dst_vertex->vertices_from.push_back(src_vertex);
  src_vertex->edges_to.emplace_back(src_vertex, dst_vertex, trans);
}